

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_keydata.cpp
# Opt level: O0

void __thiscall
KeyData_FromStringExtPubkeyDerive_Test::TestBody(KeyData_FromStringExtPubkeyDerive_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  AssertionResult gtest_ar_3;
  CfdException *e_3;
  AssertHelper local_a18;
  Message local_a10;
  bool local_a01;
  undefined1 local_a00 [8];
  AssertionResult gtest_ar__2;
  allocator local_899;
  undefined1 local_898 [8];
  string key4;
  AssertionResult gtest_ar_2;
  CfdException *e_2;
  AssertHelper local_830;
  Message local_828;
  bool local_819;
  undefined1 local_818 [8];
  AssertionResult gtest_ar__1;
  allocator local_6b1;
  undefined1 local_6b0 [8];
  string key3;
  AssertionResult gtest_ar_1;
  CfdException *e_1;
  AssertHelper local_648;
  Message local_640;
  bool local_631;
  undefined1 local_630 [8];
  AssertionResult gtest_ar_;
  allocator local_4c9;
  undefined1 local_4c8 [8];
  string key2;
  KeyData obj2;
  AssertionResult gtest_ar;
  CfdException *e;
  undefined1 local_1e0 [8];
  KeyData obj1;
  uint uStack_88;
  anon_class_1_0_00000001 check_func;
  undefined1 local_60 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> array1;
  allocator local_31;
  undefined1 local_30 [8];
  string key1;
  KeyData_FromStringExtPubkeyDerive_Test *this_local;
  
  key1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1/2"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  _uStack_88 = 0x280000001;
  this_00 = (allocator<unsigned_int> *)
            ((long)&obj1.fingerprint_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = 5;
  __l._M_array = &uStack_88;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::KeyData::KeyData((KeyData *)local_1e0);
  cfd::core::KeyData::KeyData((KeyData *)&e,(string *)local_30,-1,false);
  cfd::core::KeyData::operator=((KeyData *)local_1e0,(KeyData *)&e);
  cfd::core::KeyData::~KeyData((KeyData *)&e);
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)
             ((long)&obj1.fingerprint_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6),(KeyData *)local_1e0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  cfd::core::KeyData::KeyData((KeyData *)((long)&key2.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_4c8,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1h/2"
             ,&local_4c9);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar_.message_,(string *)local_4c8,-1,false);
  cfd::core::KeyData::operator=((KeyData *)((long)&key2.field_2 + 8),(KeyData *)&gtest_ar_.message_)
  ;
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar_.message_);
  local_631 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_630,&local_631,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_630);
  if (!bVar1) {
    testing::Message::Message(&local_640);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_1,(internal *)local_630,(AssertionResult *)0x73e488,"true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_648,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,400,pcVar2);
    testing::internal::AssertHelper::operator=(&local_648,&local_640);
    testing::internal::AssertHelper::~AssertHelper(&local_648);
    std::__cxx11::string::~string((string *)&e_1);
    testing::Message::~Message(&local_640);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_630);
  std::__cxx11::string::~string((string *)local_4c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_6b0,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/0x80000001/2"
             ,&local_6b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_6b1);
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar__1.message_,(string *)local_6b0,-1,false);
  cfd::core::KeyData::operator=
            ((KeyData *)((long)&key2.field_2 + 8),(KeyData *)&gtest_ar__1.message_);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar__1.message_);
  local_819 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_818,&local_819,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_818);
  if (!bVar1) {
    testing::Message::Message(&local_828);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_2,(internal *)local_818,(AssertionResult *)0x73e488,"true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_830,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x197,pcVar2);
    testing::internal::AssertHelper::operator=(&local_830,&local_828);
    testing::internal::AssertHelper::~AssertHelper(&local_830);
    std::__cxx11::string::~string((string *)&e_2);
    testing::Message::~Message(&local_828);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_818);
  std::__cxx11::string::~string((string *)local_6b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_898,
             "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/2147483648/2"
             ,&local_899);
  std::allocator<char>::~allocator((allocator<char> *)&local_899);
  cfd::core::KeyData::KeyData((KeyData *)&gtest_ar__2.message_,(string *)local_898,-1,false);
  cfd::core::KeyData::operator=
            ((KeyData *)((long)&key2.field_2 + 8),(KeyData *)&gtest_ar__2.message_);
  cfd::core::KeyData::~KeyData((KeyData *)&gtest_ar__2.message_);
  local_a01 = false;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_a00,&local_a01,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a00);
  if (!bVar1) {
    testing::Message::Message(&local_a10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&e_3,(internal *)local_a00,(AssertionResult *)0x73e488,"true","false",in_R9
              );
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_a18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_keydata.cpp"
               ,0x19e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_a18,&local_a10);
    testing::internal::AssertHelper::~AssertHelper(&local_a18);
    std::__cxx11::string::~string((string *)&e_3);
    testing::Message::~Message(&local_a10);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a00);
  std::__cxx11::string::~string((string *)local_898);
  cfd::core::KeyData::~KeyData((KeyData *)((long)&key2.field_2 + 8));
  cfd::core::KeyData::~KeyData((KeyData *)local_1e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_60);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(KeyData, FromStringExtPubkeyDerive) {
  std::string key1 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1/2";
  std::vector<uint32_t> array1{0x80000001, 2, 0x80000003, 1, 2};

  auto check_func = [](const KeyData& obj, const std::vector<uint32_t>& arr_obj) {
    auto obj_arr = obj.GetChildNumArray();
    EXPECT_TRUE(obj.IsValid());
    EXPECT_FALSE(obj.HasPrivkey());
    EXPECT_TRUE(obj.HasExtPubkey());
    EXPECT_FALSE(obj.HasExtPrivkey());
    EXPECT_EQ(arr_obj.size(), obj_arr.size());
    EXPECT_STREQ("1'/2/3'/1/2", obj.GetBip32Path().c_str());
    EXPECT_STREQ("3456789a", obj.GetFingerprint().GetHex().c_str());
    EXPECT_STREQ(
        "tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.GetExtPubkey().ToString().c_str());
    EXPECT_STREQ(
        "038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.GetPubkey().GetHex().c_str());
    for (size_t idx=0; idx<arr_obj.size(); ++idx) {
      EXPECT_EQ(arr_obj[idx], obj_arr[idx]);
    }
    EXPECT_STREQ(
        "[3456789a/1'/2/3'/1/2]038e04e1ba2657af7032efd287da4feaf47ac06bd18380595ae96bd626e8c2ad89",
        obj.ToString().c_str());
    EXPECT_STREQ("0x80000001/0x2/0x80000003/0x1/0x2",
        obj.GetBip32Path(HardenedType::kNumber, true).c_str());

    EXPECT_STREQ(
        "[3456789a/1h/2/3h/1/2]tpubDKETJ63aebYdrKgfJg1fAQXgiNX9WGC4YyAGU3o5F9xhqx3Q2Y2Qnn9d3LPG5wfajojW4PGmdcFJCGJaCL8mjcTAS2aD7uBS34zL5diACGD",
        obj.ToString(false, HardenedType::kSmallH).c_str());
  };

  KeyData obj1;
  try {
    obj1 = KeyData(key1);
    check_func(obj1, array1);
  } catch (const CfdException& e) {
    EXPECT_STREQ("", e.what());
  }

  // hardened error
  KeyData obj2;
  try {
    std::string key2 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/1h/2";
    obj2 = KeyData(key2);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
  try {
    std::string key3 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/0x80000001/2";
    obj2 = KeyData(key3);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
  try {
    std::string key4 = "[3456789a/1h/2/3h]tpubDF7yNiHQHdfns9Mc3XM7PYcS2dqrPqcit3FLkebvHxS4atZxifANou2KTvpQQQP82ANDCkPc5MPQZ28pjYGgmDXGy1iyzaiX6MTBv8i4cua/2147483648/2";
    obj2 = KeyData(key4);
    EXPECT_FALSE(true);
  } catch (const CfdException& e) {
    EXPECT_STREQ("Failed to extPubkey. hardened is extPrivkey only.", e.what());
  }
}